

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O0

void api_fixed_suite::fixed_push_front_iterator(void)

{
  pointer *this;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  iterator iVar1;
  iterator second_end;
  iterator first_begin;
  iterator first_end;
  allocator<int> local_c9;
  int local_c8 [4];
  iterator local_b8;
  size_type local_b0;
  undefined1 local_a8 [8];
  vector<int,_std::allocator<int>_> expect;
  allocator<int> local_69;
  int local_68 [4];
  iterator local_58;
  size_type local_50;
  undefined1 local_48 [8];
  vector<int,_std::allocator<int>_> input;
  circular_view<int,_4UL> span;
  int array [4];
  
  span.member.next = 0;
  vista::circular_view<int,_4UL>::circular_view<4UL,_0>
            ((circular_view<int,_4UL> *)
             &input.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(value_type (*) [4])&span.member.next);
  local_68[0] = 0xb;
  local_68[1] = 0x16;
  local_68[2] = 0x21;
  local_68[3] = 0x2c;
  local_58 = local_68;
  local_50 = 4;
  std::allocator<int>::allocator(&local_69);
  __l_00._M_len = local_50;
  __l_00._M_array = local_58;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_48,__l_00,&local_69);
  std::allocator<int>::~allocator(&local_69);
  iVar1 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_48);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)local_48);
  vista::circular_view<int,4ul>::
  push_front<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((circular_view<int,4ul> *)
             &input.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar1._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage);
  local_c8[0] = 0x2c;
  local_c8[1] = 0x21;
  local_c8[2] = 0x16;
  local_c8[3] = 0xb;
  local_b8 = local_c8;
  local_b0 = 4;
  std::allocator<int>::allocator(&local_c9);
  __l._M_len = local_b0;
  __l._M_array = local_b8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_a8,__l,&local_c9);
  std::allocator<int>::~allocator(&local_c9);
  this = &input.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage;
  first_begin = vista::circular_view<int,_4UL>::begin((circular_view<int,_4UL> *)this);
  first_end = vista::circular_view<int,_4UL>::end((circular_view<int,_4UL> *)this);
  iVar1 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_a8);
  second_end = std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_a8);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,4ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x3d1,"void api_fixed_suite::fixed_push_front_iterator()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar1._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             second_end._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_a8);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_48);
  return;
}

Assistant:

void fixed_push_front_iterator()
{
    int array[4] = {};
    circular_view<int, 4> span(array);
    std::vector<int> input = { 11, 22, 33, 44 };
    span.push_front(input.begin(), input.end());
    {
        std::vector<int> expect = { 44, 33, 22, 11 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}